

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.h
# Opt level: O0

Expr * __thiscall Program::makeExpr<StackAlloc,Value*&>(Program *this,Value **args)

{
  Expr *pEVar1;
  unique_ptr<StackAlloc,_std::default_delete<StackAlloc>_> *in_RDI;
  unique_ptr<StackAlloc,_std::default_delete<StackAlloc>_> *this_00;
  unique_ptr<Expr,_std::default_delete<Expr>_> *this_01;
  unique_ptr<Expr,_std::default_delete<Expr>_> *in_stack_ffffffffffffffc8;
  Program *in_stack_ffffffffffffffd0;
  unique_ptr<StackAlloc,_std::default_delete<StackAlloc>_> local_20;
  unique_ptr<Expr,_std::default_delete<Expr>_> local_18 [3];
  
  this_00 = &local_20;
  std::make_unique<StackAlloc,Value*&>((Value **)in_stack_ffffffffffffffc8);
  this_01 = local_18;
  std::unique_ptr<Expr,std::default_delete<Expr>>::
  unique_ptr<StackAlloc,std::default_delete<StackAlloc>,void>(this_01,in_RDI);
  pEVar1 = addOwnership(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::unique_ptr<Expr,_std::default_delete<Expr>_>::~unique_ptr(this_01);
  std::unique_ptr<StackAlloc,_std::default_delete<StackAlloc>_>::~unique_ptr(this_00);
  return pEVar1;
}

Assistant:

Expr* makeExpr(Args&&... args) {
        return addOwnership(std::make_unique<T>(std::forward<Args>(args)...));
    }